

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SwapOneofField
          (GeneratedMessageReflection *this,Message *message1,Message *message2,
          OneofDescriptor *oneof_descriptor)

{
  int key;
  int key_00;
  CppType CVar1;
  ulong uVar2;
  FieldDescriptor *this_00;
  double *pdVar3;
  uint *puVar4;
  unsigned_long *puVar5;
  int *piVar6;
  long *plVar7;
  float *pfVar8;
  bool *pbVar9;
  LogMessage *pLVar10;
  Message *sub_message;
  FieldDescriptor *local_c8;
  LogFinisher local_ba;
  bool temp_bool;
  LogMessage *local_b8;
  int temp_int;
  float temp_float;
  uint32 temp_uint32;
  int32 temp_int32;
  LogMessage local_a0;
  double temp_double;
  uint64 temp_uint64;
  int64 temp_int64;
  string temp_string;
  
  uVar2 = (ulong)(uint)((int)(((long)oneof_descriptor -
                              *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x40)) / 0x30) * 4 +
                       (this->schema_).oneof_case_offset_);
  key = *(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar2);
  key_00 = *(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar2);
  temp_string._M_dataplus._M_p = (pointer)&temp_string.field_2;
  temp_string._M_string_length = 0;
  temp_string.field_2._M_local_buf[0] = '\0';
  if (key == 0) {
    local_c8 = (FieldDescriptor *)0x0;
    goto LAB_003136a3;
  }
  local_c8 = Descriptor::FindFieldByNumber(this->descriptor_,key);
  CVar1 = FieldDescriptor::cpp_type(local_c8);
  switch(CVar1) {
  case CPPTYPE_INT32:
    piVar6 = GetRaw<int>(this,message1,local_c8);
    temp_int32 = *piVar6;
    break;
  case CPPTYPE_INT64:
    plVar7 = GetRaw<long>(this,message1,local_c8);
    temp_int64 = *plVar7;
    break;
  case CPPTYPE_UINT32:
    puVar4 = GetRaw<unsigned_int>(this,message1,local_c8);
    temp_uint32 = *puVar4;
    break;
  case CPPTYPE_UINT64:
    puVar5 = GetRaw<unsigned_long>(this,message1,local_c8);
    temp_uint64 = *puVar5;
    break;
  case CPPTYPE_DOUBLE:
    pdVar3 = GetRaw<double>(this,message1,local_c8);
    temp_double = *pdVar3;
    break;
  case CPPTYPE_FLOAT:
    pfVar8 = GetRaw<float>(this,message1,local_c8);
    temp_float = *pfVar8;
    break;
  case CPPTYPE_BOOL:
    pbVar9 = GetRaw<bool>(this,message1,local_c8);
    temp_bool = *pbVar9;
    break;
  case CPPTYPE_ENUM:
    piVar6 = GetRaw<int>(this,message1,local_c8);
    temp_int = *piVar6;
    break;
  case CPPTYPE_STRING:
    GetString_abi_cxx11_((string *)&local_a0,this,message1,local_c8);
    std::__cxx11::string::operator=((string *)&temp_string,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    break;
  case CPPTYPE_MESSAGE:
    local_b8 = (LogMessage *)ReleaseMessage(this,message1,local_c8,(MessageFactory *)0x0);
    goto LAB_003136ac;
  default:
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x204);
    local_b8 = LogMessage::operator<<(&local_a0,"Unimplemented type: ");
    CVar1 = FieldDescriptor::cpp_type(local_c8);
    pLVar10 = LogMessage::operator<<(local_b8,CVar1);
    LogFinisher::operator=(&local_ba,pLVar10);
    LogMessage::~LogMessage(&local_a0);
  }
LAB_003136a3:
  local_b8 = (LogMessage *)0x0;
LAB_003136ac:
  if (key_00 == 0) {
    ClearOneof(this,message1,oneof_descriptor);
  }
  else {
    this_00 = Descriptor::FindFieldByNumber(this->descriptor_,key_00);
    CVar1 = FieldDescriptor::cpp_type(this_00);
    switch(CVar1) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      piVar6 = GetRaw<int>(this,message2,this_00);
      SetField<int>(this,message1,this_00,piVar6);
      break;
    case CPPTYPE_INT64:
      plVar7 = GetRaw<long>(this,message2,this_00);
      SetField<long>(this,message1,this_00,plVar7);
      break;
    case CPPTYPE_UINT32:
      puVar4 = GetRaw<unsigned_int>(this,message2,this_00);
      SetField<unsigned_int>(this,message1,this_00,puVar4);
      break;
    case CPPTYPE_UINT64:
      puVar5 = GetRaw<unsigned_long>(this,message2,this_00);
      SetField<unsigned_long>(this,message1,this_00,puVar5);
      break;
    case CPPTYPE_DOUBLE:
      pdVar3 = GetRaw<double>(this,message2,this_00);
      SetField<double>(this,message1,this_00,pdVar3);
      break;
    case CPPTYPE_FLOAT:
      pfVar8 = GetRaw<float>(this,message2,this_00);
      SetField<float>(this,message1,this_00,pfVar8);
      break;
    case CPPTYPE_BOOL:
      pbVar9 = GetRaw<bool>(this,message2,this_00);
      SetField<bool>(this,message1,this_00,pbVar9);
      break;
    case CPPTYPE_STRING:
      GetString_abi_cxx11_((string *)&local_a0,this,message2,this_00);
      SetString(this,message1,this_00,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      break;
    case CPPTYPE_MESSAGE:
      sub_message = ReleaseMessage(this,message2,this_00,(MessageFactory *)0x0);
      SetAllocatedMessage(this,message1,sub_message,this_00);
      break;
    default:
      LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x226);
      pLVar10 = LogMessage::operator<<(&local_a0,"Unimplemented type: ");
      CVar1 = FieldDescriptor::cpp_type(this_00);
      pLVar10 = LogMessage::operator<<(pLVar10,CVar1);
      LogFinisher::operator=(&local_ba,pLVar10);
      LogMessage::~LogMessage(&local_a0);
    }
  }
  if (key == 0) {
    ClearOneof(this,message2,oneof_descriptor);
    goto LAB_00313b86;
  }
  CVar1 = FieldDescriptor::cpp_type(local_c8);
  switch(CVar1) {
  case CPPTYPE_INT32:
    piVar6 = &temp_int32;
    goto LAB_00313abd;
  case CPPTYPE_INT64:
    SetField<long>(this,message2,local_c8,&temp_int64);
    break;
  case CPPTYPE_UINT32:
    SetField<unsigned_int>(this,message2,local_c8,&temp_uint32);
    break;
  case CPPTYPE_UINT64:
    SetField<unsigned_long>(this,message2,local_c8,&temp_uint64);
    break;
  case CPPTYPE_DOUBLE:
    SetField<double>(this,message2,local_c8,&temp_double);
    break;
  case CPPTYPE_FLOAT:
    SetField<float>(this,message2,local_c8,&temp_float);
    break;
  case CPPTYPE_BOOL:
    SetField<bool>(this,message2,local_c8,&temp_bool);
    break;
  case CPPTYPE_ENUM:
    piVar6 = &temp_int;
LAB_00313abd:
    SetField<int>(this,message2,local_c8,piVar6);
    break;
  case CPPTYPE_STRING:
    SetString(this,message2,local_c8,&temp_string);
    break;
  case CPPTYPE_MESSAGE:
    SetAllocatedMessage(this,message2,(Message *)local_b8,local_c8);
    break;
  default:
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x246);
    pLVar10 = LogMessage::operator<<(&local_a0,"Unimplemented type: ");
    CVar1 = FieldDescriptor::cpp_type(local_c8);
    pLVar10 = LogMessage::operator<<(pLVar10,CVar1);
    LogFinisher::operator=(&local_ba,pLVar10);
    LogMessage::~LogMessage(&local_a0);
  }
LAB_00313b86:
  std::__cxx11::string::~string((string *)&temp_string);
  return;
}

Assistant:

void GeneratedMessageReflection::SwapOneofField(
    Message* message1,
    Message* message2,
    const OneofDescriptor* oneof_descriptor) const {
  uint32 oneof_case1 = GetOneofCase(*message1, oneof_descriptor);
  uint32 oneof_case2 = GetOneofCase(*message2, oneof_descriptor);

  int32 temp_int32;
  int64 temp_int64;
  uint32 temp_uint32;
  uint64 temp_uint64;
  float temp_float;
  double temp_double;
  bool temp_bool;
  int temp_int;
  Message* temp_message = NULL;
  string temp_string;

  // Stores message1's oneof field to a temp variable.
  const FieldDescriptor* field1 = NULL;
  if (oneof_case1 > 0) {
    field1 = descriptor_->FindFieldByNumber(oneof_case1);
    //oneof_descriptor->field(oneof_case1);
    switch (field1->cpp_type()) {
#define GET_TEMP_VALUE(CPPTYPE, TYPE)                                   \
      case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
        temp_##TYPE = GetField<TYPE>(*message1, field1);                \
        break;

      GET_TEMP_VALUE(INT32 , int32 );
      GET_TEMP_VALUE(INT64 , int64 );
      GET_TEMP_VALUE(UINT32, uint32);
      GET_TEMP_VALUE(UINT64, uint64);
      GET_TEMP_VALUE(FLOAT , float );
      GET_TEMP_VALUE(DOUBLE, double);
      GET_TEMP_VALUE(BOOL  , bool  );
      GET_TEMP_VALUE(ENUM  , int   );
#undef GET_TEMP_VALUE
      case FieldDescriptor::CPPTYPE_MESSAGE:
        temp_message = ReleaseMessage(message1, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        temp_string = GetString(*message1, field1);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  }

  // Sets message1's oneof field from the message2's oneof field.
  if (oneof_case2 > 0) {
    const FieldDescriptor* field2 =
        descriptor_->FindFieldByNumber(oneof_case2);
    switch (field2->cpp_type()) {
#define SET_ONEOF_VALUE1(CPPTYPE, TYPE)                                 \
      case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
        SetField<TYPE>(message1, field2, GetField<TYPE>(*message2, field2)); \
        break;

      SET_ONEOF_VALUE1(INT32 , int32 );
      SET_ONEOF_VALUE1(INT64 , int64 );
      SET_ONEOF_VALUE1(UINT32, uint32);
      SET_ONEOF_VALUE1(UINT64, uint64);
      SET_ONEOF_VALUE1(FLOAT , float );
      SET_ONEOF_VALUE1(DOUBLE, double);
      SET_ONEOF_VALUE1(BOOL  , bool  );
      SET_ONEOF_VALUE1(ENUM  , int   );
#undef SET_ONEOF_VALUE1
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message1,
                            ReleaseMessage(message2, field2),
                            field2);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message1, field2, GetString(*message2, field2));
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field2->cpp_type();
    }
  } else {
    ClearOneof(message1, oneof_descriptor);
  }

  // Sets message2's oneof field from the temp variable.
  if (oneof_case1 > 0) {
    switch (field1->cpp_type()) {
#define SET_ONEOF_VALUE2(CPPTYPE, TYPE)                                 \
      case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
        SetField<TYPE>(message2, field1, temp_##TYPE);                  \
        break;

      SET_ONEOF_VALUE2(INT32 , int32 );
      SET_ONEOF_VALUE2(INT64 , int64 );
      SET_ONEOF_VALUE2(UINT32, uint32);
      SET_ONEOF_VALUE2(UINT64, uint64);
      SET_ONEOF_VALUE2(FLOAT , float );
      SET_ONEOF_VALUE2(DOUBLE, double);
      SET_ONEOF_VALUE2(BOOL  , bool  );
      SET_ONEOF_VALUE2(ENUM  , int   );
#undef SET_ONEOF_VALUE2
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message2, temp_message, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message2, field1, temp_string);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  } else {
    ClearOneof(message2, oneof_descriptor);
  }
}